

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::~ArrayBuilder
          (ArrayBuilder<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *this)

{
  Array<capnp::Orphan<capnp::compiler::Token>_> *pAVar1;
  RemoveConst<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *pRVar2;
  Array<capnp::Orphan<capnp::compiler::Token>_> *pAVar3;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0) {
    pRVar2 = this->pos;
    pAVar3 = this->endPtr;
    this->ptr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
    this->pos = (RemoveConst<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *)0x0;
    this->endPtr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pAVar1,0x18,((long)pRVar2 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ((long)pAVar3 - (long)pAVar1 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::Array<capnp::Orphan<capnp::compiler::Token>_>,_false>::
               destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }